

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Radio_Communications_Header.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Radio_Communications_Header::Radio_Communications_Header
          (Radio_Communications_Header *this,EntityIdentifier *ID,KUINT16 RadioID)

{
  KUINT16 KVar1;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Radio_Communications_Header_00225708;
  (this->m_EntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00216f20;
  KVar1 = (ID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_EntityID).super_SimulationIdentifier.m_ui16SiteID =
       (ID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_EntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_EntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00216bc0;
  *(undefined2 *)&(this->m_EntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(ID->super_SimulationIdentifier).field_0xc;
  this->m_ui16RadioID = RadioID;
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x04';
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x05';
  return;
}

Assistant:

Radio_Communications_Header::Radio_Communications_Header( const EntityIdentifier & ID, KUINT16 RadioID ) :
    m_EntityID( ID ),
    m_ui16RadioID( RadioID )
{
    m_ui8ProtocolFamily = Radio_Communications;
    m_ui8ProtocolVersion = IEEE_1278_1_1995;
}